

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void Centaurus::MatchRoutineEM64T<unsigned_char>::emit
               (X86Assembler *as,MyConstPool *pool,Label *rejectlabel,
               basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
               *str)

{
  UInt64 UVar1;
  anon_union_8_2_78723da6_for_MemData_2 aVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  Data128 d1;
  anon_union_16_7_ed616b9d_for_Operand__0 local_a0;
  UInt64 local_90;
  Operand_ *local_88;
  Operand_ *local_80;
  undefined8 local_78;
  Operand_ *local_70;
  ConstPool *local_68;
  MyConstPool *local_60;
  anon_union_16_7_ed616b9d_for_Operand__0 local_58;
  uint32_t local_48 [2];
  UInt64 local_40;
  anon_union_8_2_78723da6_for_MemData_2 local_38;
  
  uVar5 = str->_M_string_length;
  local_88 = (Operand_ *)rejectlabel;
  if (uVar5 < 8) {
    if (uVar5 != 0) {
      uVar5 = 0;
      do {
        local_a0._packed[0] = (UInt64)8.28907076174039e-317;
        local_a0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
        ::asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x1ad,(Operand_ *)(::asmjit::x86OpData + 0x480),
                   (Operand_ *)&local_a0._any);
        ::asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x105,(Operand_ *)(::asmjit::x86OpData + 0x4e0));
        ::asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x67,(Operand_ *)(::asmjit::x86OpData + 0x480),
                   (uint)(str->_M_dataplus)._M_p[uVar5]);
        ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x124,local_88);
        uVar5 = uVar5 + 1;
      } while (uVar5 < str->_M_string_length);
    }
  }
  else {
    local_68 = &pool->m_pool;
    iVar4 = 0x10;
    uVar3 = 0;
    local_78 = 0x197da8;
    local_70 = (Operand_ *)(::asmjit::x86OpData + 0x4e0);
    local_80 = (Operand_ *)(::asmjit::x86OpData + 0x490);
    local_90 = (UInt64)str;
    local_60 = pool;
    do {
      aVar2.offset64 = uVar5 - uVar3;
      if (0xf < aVar2.offset64) {
        aVar2.offset64 = 0x10;
      }
      UVar1 = local_90;
      if (uVar5 != uVar3) {
        memcpy(&local_40,(void *)(uVar3 + *(long *)local_90),aVar2.offset64 + (aVar2.offset64 == 0))
        ;
        UVar1 = local_40;
      }
      local_a0._packed[0] = (UInt64)0x32;
      local_a0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
      ::asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x191,(Operand_ *)(::asmjit::x86OpData + 0x700),
                 (Operand_ *)&local_a0._any);
      local_a0._mem.field_2 = local_38;
      local_a0._packed[0] = UVar1;
      ::asmjit::ConstPool::add(local_68,&local_a0,0x10,(size_t *)local_48);
      local_58._packed[0].i64 = (UInt64)0xa;
      local_58._any.reserved12_4 = (local_60->m_label).super_Operand.super_Operand_.field_0._any.id;
      local_a0._packed[0] = (UInt64)0x3;
      local_a0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x18;
      local_58._any.reserved8_4 = local_48[0];
      ::asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x1e1,(Operand_ *)(::asmjit::x86OpData + 0x700),
                 (Operand_ *)&local_58._any,(Operand_ *)&local_a0._any);
      local_a0._packed[0].i64 = (UInt64)0x3;
      local_a0._8_8_ = aVar2;
      ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,local_80,(Operand_ *)&local_a0._any);
      ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x115,local_88);
      ::asmjit::CodeEmitter::emit((CodeEmitter *)as,7,local_70,aVar2.field_1.offsetLo32);
      uVar3 = (ulong)iVar4;
      iVar4 = iVar4 + 0x10;
      uVar5 = *(size_type *)(local_90.i64 + 8);
    } while (uVar3 < uVar5);
  }
  return;
}

Assistant:

void MatchRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, MyConstPool& pool, asmjit::Label& rejectlabel, const std::basic_string<TCHAR>& str)
{
    if (str.size() < 8)
    {
        for (int i = 0; i < str.size(); i++)
        {
            if (sizeof(TCHAR) == 1)
            {
                as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
                as.inc(INPUT_REG);
            }
            else
            {
                as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
                as.add(INPUT_REG, 2);
            }
            as.cmp(CHAR_REG, str[i]);
            as.jne(rejectlabel);
        }
    }
    else
    {
        for (int i = 0; i < str.size(); i += 16 / sizeof(TCHAR))
        {
            int l1 = std::min(str.size() - i, (size_t)(16 / sizeof(TCHAR)));

            asmjit::Data128 d1;

            for (int j = 0; j < l1; j++)
            {
                if (sizeof(TCHAR) == 1)
                    d1.ub[j] = str[i + j];
                else
                    d1.uw[j] = str[i + j];
            }

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(LOAD_REG, pool.add(d1), asmjit::Imm(sizeof(TCHAR) == 1 ? 0x18 : 0x19));
            as.cmp(INDEX_REG, asmjit::Imm(l1));
            as.jb(rejectlabel);
            as.add(INPUT_REG, l1);
        }
    }
}